

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
pbrt::BasicScene::SetOptions
          (BasicScene *this,SceneEntity *filter,SceneEntity *film,CameraSceneEntity *camera,
          SceneEntity *sampler,SceneEntity *integ,SceneEntity *accel)

{
  float fVar1;
  RGBColorSpace *pRVar2;
  polymorphic_allocator<std::byte> *ppVar3;
  AsyncJob<pbrt::Sampler> *pAVar4;
  AsyncJob<pbrt::Camera> *pAVar5;
  ThreadLocal<pstd::pmr::polymorphic_allocator<std::byte>_> *in_RDX;
  FileLoc *in_RSI;
  long in_RDI;
  CameraTransform *in_R9;
  Float FVar6;
  Float FVar7;
  ParameterDictionary *in_stack_00000008;
  Float exposureTime;
  Filter filt;
  Allocator alloc;
  SceneEntity *in_stack_fffffffffffff9f8;
  SceneEntity *pSVar8;
  SceneEntity *in_stack_fffffffffffffa00;
  CameraSceneEntity *in_stack_fffffffffffffa10;
  allocator<char> *in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa38;
  undefined4 in_stack_fffffffffffffa3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  FileLoc *in_stack_fffffffffffffa50;
  ParameterDictionary *in_stack_fffffffffffffa58;
  undefined4 in_stack_fffffffffffffa60;
  undefined4 in_stack_fffffffffffffa64;
  Allocator in_stack_fffffffffffffa68;
  ParameterDictionary *parameters;
  InternedString in_stack_fffffffffffffab0;
  Allocator in_stack_fffffffffffffab8;
  undefined8 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined8 in_stack_fffffffffffffb18;
  LogLevel in_stack_fffffffffffffb24;
  anon_class_1008_2_669f6384_for__M_f *in_stack_fffffffffffffe60;
  allocator<char> local_a9;
  string local_a8 [55];
  allocator<char> local_71;
  string local_70 [36];
  float local_4c;
  SceneEntity *local_48;
  SceneEntity *local_38;
  
  pRVar2 = ParameterDictionary::ColorSpace
                     ((ParameterDictionary *)((long)&(in_RDX->mutex)._M_impl._M_rwlock + 0x20));
  *(RGBColorSpace **)(in_RDI + 0x120) = pRVar2;
  SceneEntity::operator=(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  SceneEntity::operator=(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
  parameters = in_stack_00000008;
  if (logging::logLevel < 1) {
    Log(in_stack_fffffffffffffb24,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
        (char *)in_stack_fffffffffffffb08);
    parameters = in_stack_00000008;
  }
  ppVar3 = ThreadLocal<pstd::pmr::polymorphic_allocator<std::byte>_>::Get(in_RDX);
  local_38 = (SceneEntity *)ppVar3->memoryResource;
  InternedString::operator_cast_to_string_((InternedString *)in_RSI);
  local_48 = local_38;
  Filter::Create((string *)CONCAT44(in_stack_fffffffffffffa64,in_stack_fffffffffffffa60),
                 in_stack_fffffffffffffa58,in_stack_fffffffffffffa50,in_stack_fffffffffffffa68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,
             (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
             in_stack_fffffffffffffa30);
  FVar6 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffffa00,
                     (string *)in_stack_fffffffffffff9f8,0.0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffa40,
             (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
             in_stack_fffffffffffffa30);
  FVar7 = ParameterDictionary::GetOneFloat
                    ((ParameterDictionary *)in_stack_fffffffffffffa00,
                     (string *)in_stack_fffffffffffff9f8,0.0);
  fVar1 = FVar6 - FVar7;
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  local_4c = fVar1;
  if (fVar1 <= 0.0) {
    ErrorExit((FileLoc *)in_stack_fffffffffffffa00,(char *)in_stack_fffffffffffff9f8);
  }
  InternedString::operator_cast_to_string_((InternedString *)in_RDX);
  Filter::Filter((Filter *)in_stack_fffffffffffffa00,(Filter *)in_stack_fffffffffffff9f8);
  pSVar8 = local_38;
  Film::Create(in_stack_fffffffffffffab0.str,parameters,(Float)((ulong)in_RDI >> 0x20),in_R9,
               (Filter *)in_RDX,in_RSI,in_stack_fffffffffffffab8);
  Film::operator=((Film *)in_stack_fffffffffffffa00,(Film *)pSVar8);
  if (logging::logLevel < 1) {
    Log(in_stack_fffffffffffffb24,(char *)in_stack_fffffffffffffb18,in_stack_fffffffffffffb14,
        (char *)in_stack_fffffffffffffb08);
  }
  SceneEntity::SceneEntity(in_stack_fffffffffffffa00,pSVar8);
  pAVar4 = RunAsync<pbrt::BasicScene::SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)::__0>
                     ((anon_class_152_2_c356fade_for__M_f *)
                      CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  *(AsyncJob<pbrt::Sampler> **)(in_RDI + 0x1a0) = pAVar4;
  SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)
  ::$_0::~__0((anon_class_152_2_c356fade_for__M_f *)0x51a6d6);
  CameraSceneEntity::CameraSceneEntity
            (in_stack_fffffffffffffa10,(CameraSceneEntity *)&stack0xfffffffffffffab0);
  pAVar5 = RunAsync<pbrt::BasicScene::SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)::__1>
                     (in_stack_fffffffffffffe60);
  *(AsyncJob<pbrt::Camera> **)(in_RDI + 0x250) = pAVar5;
  SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)
  ::$_1::~__1((anon_class_1008_2_669f6384_for__M_f *)0x51a732);
  return;
}

Assistant:

void BasicScene::SetOptions(SceneEntity filter, SceneEntity film,
                            CameraSceneEntity camera, SceneEntity sampler,
                            SceneEntity integ, SceneEntity accel) {
    // Store information for specified integrator and accelerator
    filmColorSpace = film.parameters.ColorSpace();
    integrator = integ;
    accelerator = accel;

    // Immediately create filter and film
    LOG_VERBOSE("Starting to create filter and film");
    Allocator alloc = threadAllocators.Get();
    Filter filt = Filter::Create(filter.name, filter.parameters, &filter.loc, alloc);

    // It's a little ugly to poke into the camera's parameters here, but we
    // have this circular dependency that Camera::Create() expects a
    // Film, yet now the film needs to know the exposure time from
    // the camera....
    Float exposureTime = camera.parameters.GetOneFloat("shutterclose", 1.f) -
                         camera.parameters.GetOneFloat("shutteropen", 0.f);
    if (exposureTime <= 0)
        ErrorExit(&camera.loc,
                  "The specified camera shutter times imply that the shutter "
                  "does not open.  A black image will result.");

    this->film = Film::Create(film.name, film.parameters, exposureTime,
                              camera.cameraTransform, filt, &film.loc, alloc);
    LOG_VERBOSE("Finished creating filter and film");

    // Enqueue asynchronous job to create sampler
    samplerJob = RunAsync([sampler, this]() {
        LOG_VERBOSE("Starting to create sampler");
        Allocator alloc = threadAllocators.Get();
        Point2i res = this->film.FullResolution();
        return Sampler::Create(sampler.name, sampler.parameters, res, &sampler.loc,
                               alloc);
    });

    // Enqueue asynchronous job to create camera
    cameraJob = RunAsync([camera, this]() {
        LOG_VERBOSE("Starting to create camera");
        Allocator alloc = threadAllocators.Get();
        Medium cameraMedium = GetMedium(camera.medium, &camera.loc);

        Camera c = Camera::Create(camera.name, camera.parameters, cameraMedium,
                                  camera.cameraTransform, this->film, &camera.loc, alloc);
        LOG_VERBOSE("Finished creating camera");
        return c;
    });
}